

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool __thiscall ON_SubDRTree::CreateSubDEmptyRTree(ON_SubDRTree *this,ON_SubD *subd)

{
  long *plVar1;
  long *memblock;
  
  ON_SubD::ShareContentsFrom((ON_SubD *)(this + 0x48),subd);
  *(undefined8 *)this = 0;
  memblock = *(long **)(this + 0x30);
  if (memblock != (long *)0x0) {
    *(undefined8 *)(this + 0x30) = 0;
    *(undefined8 *)(this + 0x38) = 0;
    *(undefined8 *)(this + 0x20) = 0;
    *(undefined8 *)(this + 0x28) = 0;
    *(undefined8 *)(this + 0x10) = 0;
    *(undefined8 *)(this + 0x18) = 0;
    *(undefined8 *)(this + 0x40) = 0;
    do {
      plVar1 = (long *)*memblock;
      onfree(memblock);
      memblock = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  return true;
}

Assistant:

bool ON_SubDRTree::CreateSubDEmptyRTree(
  const ON_SubD& subd
)
{
  // ShareContentsFrom() increments the reference count on m_subdimple_sp
  // so vertex pointers one this RTree's nodes will be valid for the duration
  // of the rtree's existence.
  m_subd.ShareContentsFrom(const_cast<ON_SubD&>(subd));
  this->RemoveAll();
  return true;
}